

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O3

uint GetAutoSenseRadix(StringRef *Str)

{
  uint uVar1;
  short *psVar2;
  long lVar3;
  
  if (Str->Length < 2) {
    return 10;
  }
  psVar2 = (short *)Str->Data;
  if ((*psVar2 == 0x7830) || (*psVar2 == 0x5830)) {
    uVar1 = 0x10;
  }
  else if ((*psVar2 == 0x6230) || (*psVar2 == 0x4230)) {
    uVar1 = 2;
  }
  else {
    if (*psVar2 != 0x6f30) {
      if ((char)*psVar2 != '0') {
        return 10;
      }
      if (9 < (byte)(*(char *)((long)psVar2 + 1) - 0x30U)) {
        return 10;
      }
      psVar2 = (short *)((long)psVar2 + 1);
      uVar1 = 8;
      lVar3 = -1;
      goto LAB_0012d288;
    }
    uVar1 = 8;
  }
  psVar2 = psVar2 + 1;
  lVar3 = -2;
LAB_0012d288:
  Str->Data = (char *)psVar2;
  Str->Length = Str->Length + lVar3;
  return uVar1;
}

Assistant:

bool empty() const { return Length == 0; }